

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_verifier.h
# Opt level: O0

int Fantasy_Movie_verify_table(flatcc_table_verifier_descriptor_t *td)

{
  int ret;
  flatcc_table_verifier_descriptor_t *td_local;
  
  td_local._4_4_ = flatcc_verify_union_field(td,1,0,Fantasy_Character_union_verifier);
  if ((((td_local._4_4_ == 0) &&
       (td_local._4_4_ = flatcc_verify_union_field(td,3,0,Fantasy_Character_union_verifier),
       td_local._4_4_ == 0)) &&
      (td_local._4_4_ = flatcc_verify_union_field(td,5,0,Fantasy_Character_union_verifier),
      td_local._4_4_ == 0)) &&
     ((td_local._4_4_ = flatcc_verify_union_field(td,7,0,Fantasy_Character_union_verifier),
      td_local._4_4_ == 0 &&
      (td_local._4_4_ = flatcc_verify_union_vector_field(td,9,0,Fantasy_Character_union_verifier),
      td_local._4_4_ == 0)))) {
    td_local._4_4_ = 0;
  }
  return td_local._4_4_;
}

Assistant:

static int Fantasy_Movie_verify_table(flatcc_table_verifier_descriptor_t *td)
{
    int ret;
    if ((ret = flatcc_verify_union_field(td, 1, 0, &Fantasy_Character_union_verifier) /* main_character */)) return ret;
    if ((ret = flatcc_verify_union_field(td, 3, 0, &Fantasy_Character_union_verifier) /* antagonist */)) return ret;
    if ((ret = flatcc_verify_union_field(td, 5, 0, &Fantasy_Character_union_verifier) /* side_kick */)) return ret;
    if ((ret = flatcc_verify_union_field(td, 7, 0, &Fantasy_Character_union_verifier) /* cameo */)) return ret;
    if ((ret = flatcc_verify_union_vector_field(td, 9, 0, &Fantasy_Character_union_verifier) /* characters */)) return ret;
    return flatcc_verify_ok;
}